

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

bool __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
is_selected(list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,unsigned_long index)

{
  data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pdVar1;
  unsigned_long in_RSI;
  long in_RDI;
  auto_mutex M;
  rmutex *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar2;
  
  auto_mutex::auto_mutex
            ((auto_mutex *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  pdVar1 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
           ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                         *)(in_RDI + 0x1260),in_RSI);
  bVar2 = pdVar1->is_selected;
  auto_mutex::~auto_mutex((auto_mutex *)0x44e6a9);
  return (bool)(bVar2 & 1);
}

Assistant:

bool list_box<S>::
    is_selected (
        unsigned long index
    ) const
    {
        auto_mutex M(m);
        DLIB_ASSERT ( index < size() ,
                "\tbool list_box::is_selected(index)"
                << "\n\tindex:  " << index 
                << "\n\tsize(): " << size() );

        return items[index].is_selected;
    }